

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

int secp256k1_jacobi64_maybe_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  secp256k1_gej *psVar1;
  secp256k1_gej *psVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  secp256k1_scalar *a;
  int iVar7;
  secp256k1_ge *unaff_RBX;
  secp256k1_ge *psVar8;
  secp256k1_gej *psVar9;
  long lVar10;
  uint uVar11;
  code *unaff_RBP;
  secp256k1_ge *psVar12;
  ulong uVar13;
  uint64_t *puVar14;
  uint64_t *puVar15;
  secp256k1_gej *psVar16;
  secp256k1_ge *psVar17;
  int iVar18;
  secp256k1_gej *psVar19;
  uint uVar20;
  secp256k1_ge *unaff_R12;
  secp256k1_gej *unaff_R13;
  secp256k1_gej *psVar21;
  secp256k1_gej *psVar22;
  secp256k1_ge *unaff_R14;
  secp256k1_ge *psVar23;
  secp256k1_fe *psVar24;
  secp256k1_gej *unaff_R15;
  secp256k1_gej *psVar25;
  ulong uVar26;
  bool bVar27;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_trans2x2 t;
  ulong uStack_f40;
  undefined1 auStack_f30 [32];
  undefined1 auStack_f10 [88];
  uint64_t uStack_eb8;
  uint64_t uStack_eb0;
  uint64_t uStack_ea8;
  uint64_t uStack_ea0;
  int iStack_e98;
  int iStack_e94;
  secp256k1_fe sStack_e90;
  undefined4 uStack_e60;
  secp256k1_fe sStack_e50;
  secp256k1_scalar sStack_e20;
  secp256k1_ge sStack_e00;
  secp256k1_fe asStack_d68 [31];
  secp256k1_ge sStack_780;
  secp256k1_fe asStack_6e8 [31];
  secp256k1_ge *psStack_f8;
  secp256k1_ge *psStack_f0;
  secp256k1_gej *psStack_e8;
  secp256k1_ge *psStack_e0;
  secp256k1_gej *psStack_d8;
  code *pcStack_d0;
  undefined1 local_c8 [128];
  secp256k1_gej *local_48;
  secp256k1_ge *local_40;
  secp256k1_gej *local_38;
  
  bVar4 = 0;
  psVar21 = (secp256k1_gej *)local_c8;
  psVar22 = (secp256k1_gej *)local_c8;
  local_c8._80_8_ = (modinfo->modulus).v[4];
  psVar25 = (secp256k1_gej *)(modinfo->modulus).v[0];
  local_c8._56_8_ = (modinfo->modulus).v[1];
  local_c8._64_8_ = (modinfo->modulus).v[2];
  local_c8._72_8_ = (modinfo->modulus).v[3];
  local_c8._0_8_ = x->v[0];
  local_c8._8_8_ = x->v[1];
  local_c8._16_8_ = x->v[2];
  local_c8._24_8_ = x->v[3];
  local_c8._32_8_ = x->v[4];
  psVar12 = (secp256k1_ge *)modinfo;
  local_c8._48_8_ = psVar25;
  if (((((long)local_c8._0_8_ < 0) || ((long)local_c8._8_8_ < 0)) ||
      (unaff_RBX = (secp256k1_ge *)modinfo, psVar12 = (secp256k1_ge *)local_c8._16_8_,
      (long)local_c8._16_8_ < 0)) ||
     ((x = (secp256k1_modinv64_signed62 *)local_c8._24_8_, (long)local_c8._24_8_ < 0 ||
      ((long)local_c8._32_8_ < 0)))) {
LAB_00147dd8:
    pcStack_d0 = (code *)0x147ddd;
    secp256k1_jacobi64_maybe_var_cold_18();
  }
  else {
    psVar12 = (secp256k1_ge *)
              (local_c8._16_8_ | local_c8._24_8_ | local_c8._8_8_ | local_c8._0_8_ | local_c8._32_8_
              );
    if (psVar12 != (secp256k1_ge *)0x0) {
      unaff_R14 = (secp256k1_ge *)0x5;
      unaff_RBP = (code *)0xffffffffffffffff;
      local_c8._104_8_ = 0;
      psVar8 = (secp256k1_ge *)0x0;
      local_c8._96_8_ = modinfo;
      do {
        unaff_RBX = (secp256k1_ge *)local_c8._96_8_;
        x = (secp256k1_modinv64_signed62 *)(local_c8._56_8_ << 0x3e | (ulong)psVar25);
        puVar14 = (uint64_t *)(local_c8._8_8_ << 0x3e | local_c8._0_8_);
        psVar1 = (secp256k1_gej *)0x0;
        psVar17 = (secp256k1_ge *)0x0;
        psVar25 = (secp256k1_gej *)0x1;
        iVar6 = 0x3e;
        psVar23 = (secp256k1_ge *)0x1;
        puVar15 = puVar14;
        psVar19 = (secp256k1_gej *)x;
        while( true ) {
          uVar13 = -1L << ((byte)iVar6 & 0x3f) | (ulong)puVar15;
          lVar10 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          bVar3 = (byte)lVar10;
          psVar16 = (secp256k1_gej *)((ulong)puVar15 >> (bVar3 & 0x3f));
          psVar23 = (secp256k1_ge *)((long)psVar23 << (bVar3 & 0x3f));
          psVar1 = (secp256k1_gej *)((long)psVar1 << (bVar3 & 0x3f));
          unaff_RBP = unaff_RBP + -lVar10;
          psVar12 = (secp256k1_ge *)((ulong)psVar19 >> 2);
          uVar20 = ((uint)((ulong)psVar19 >> 1) ^ (uint)psVar12) & (uint)lVar10 ^ (uint)psVar8;
          unaff_R12 = (secp256k1_ge *)(ulong)uVar20;
          iVar6 = iVar6 - (uint)lVar10;
          local_c8._112_8_ = unaff_R14;
          if (iVar6 == 0) break;
          if (((ulong)psVar19 & 1) == 0) {
            pcStack_d0 = (code *)0x147d8d;
            secp256k1_jacobi64_maybe_var_cold_7();
LAB_00147d8d:
            pcStack_d0 = (code *)0x147d92;
            secp256k1_jacobi64_maybe_var_cold_6();
LAB_00147d92:
            pcStack_d0 = (code *)0x147d97;
            secp256k1_jacobi64_maybe_var_cold_1();
LAB_00147d97:
            pcStack_d0 = (code *)0x147d9c;
            secp256k1_jacobi64_maybe_var_cold_2();
            goto LAB_00147d9c;
          }
          if (((ulong)psVar16 & 1) == 0) goto LAB_00147d8d;
          psVar12 = (secp256k1_ge *)((long)psVar1 * (long)puVar14 + (long)psVar23 * (long)x);
          bVar3 = 0x3e - (char)iVar6;
          psVar8 = (secp256k1_ge *)((long)psVar19 << (bVar3 & 0x3f));
          if (psVar12 != psVar8) goto LAB_00147d92;
          psVar8 = (secp256k1_ge *)((long)psVar25 * (long)puVar14 + (long)psVar17 * (long)x);
          psVar12 = (secp256k1_ge *)((long)psVar16 << (bVar3 & 0x3f));
          if (psVar8 != psVar12) goto LAB_00147d97;
          iVar18 = (int)psVar19;
          iVar7 = (int)psVar16;
          if ((long)unaff_RBP < 0) {
            unaff_RBP = (code *)-(long)unaff_RBP;
            iVar5 = (int)unaff_RBP + 1;
            if (iVar6 <= iVar5) {
              iVar5 = iVar6;
            }
            psVar12 = (secp256k1_ge *)(ulong)(iVar5 - 0x3fU);
            if (0xffffffc1 < iVar5 - 0x3fU) {
              psVar8 = (secp256k1_ge *)
                       (ulong)(uVar20 ^ (uint)(((ulong)psVar16 & (ulong)psVar19) >> 1));
              uVar13 = (ulong)(0x3fL << (-(char)iVar5 & 0x3fU)) >> (-(char)iVar5 & 0x3fU);
              uVar20 = (iVar7 * iVar7 + 0x3e) * iVar7 * iVar18 & (uint)uVar13;
              psVar2 = psVar1;
              psVar1 = psVar25;
              psVar9 = psVar16;
              psVar12 = psVar23;
              psVar23 = psVar17;
              goto LAB_00147b85;
            }
            goto LAB_00147da6;
          }
          iVar5 = (int)unaff_RBP + 1;
          if (iVar6 <= iVar5) {
            iVar5 = iVar6;
          }
          psVar12 = (secp256k1_ge *)(ulong)(iVar5 - 0x3fU);
          if (iVar5 - 0x3fU < 0xffffffc2) goto LAB_00147da1;
          uVar13 = (ulong)(0xfL << (-(char)iVar5 & 0x3fU)) >> (-(char)iVar5 & 0x3fU);
          uVar20 = -(iVar7 * ((iVar18 * 2 + 2U & 8) + iVar18)) & (uint)uVar13;
          psVar2 = psVar25;
          psVar9 = psVar19;
          psVar12 = psVar17;
          psVar19 = psVar16;
          psVar8 = unaff_R12;
LAB_00147b85:
          uVar26 = (ulong)uVar20;
          puVar15 = (uint64_t *)((long)(psVar19->x).n + uVar26 * (long)psVar9);
          psVar17 = (secp256k1_ge *)((long)(psVar12->x).n + (long)psVar23 * uVar26);
          psVar25 = (secp256k1_gej *)((long)(psVar2->x).n + uVar26 * (long)psVar1);
          psVar19 = psVar9;
          unaff_R12 = psVar8;
          if (((ulong)puVar15 & uVar13) != 0) {
LAB_00147d9c:
            pcStack_d0 = (code *)0x147da1;
            secp256k1_jacobi64_maybe_var_cold_4();
LAB_00147da1:
            pcStack_d0 = (code *)0x147da6;
            secp256k1_jacobi64_maybe_var_cold_3();
LAB_00147da6:
            pcStack_d0 = (code *)0x147dab;
            secp256k1_jacobi64_maybe_var_cold_5();
            goto LAB_00147dab;
          }
        }
        x = (secp256k1_modinv64_signed62 *)((long)psVar1 * (long)psVar17);
        lVar10 = (long)psVar23 * (long)psVar25 - (long)x;
        uVar13 = (ulong)((secp256k1_gej *)((long)psVar23 * (long)psVar25) < x);
        uVar26 = SUB168(SEXT816((long)psVar23) * SEXT816((long)psVar25),8) -
                 SUB168(SEXT816((long)psVar1) * SEXT816((long)psVar17),8);
        local_c8._120_8_ = psVar23;
        local_48 = psVar1;
        local_40 = psVar17;
        local_38 = psVar25;
        if ((lVar10 != 0x4000000000000000 || uVar26 != uVar13) &&
           (uVar26 - uVar13 != -1 || lVar10 != -0x4000000000000000)) {
LAB_00147dab:
          pcStack_d0 = (code *)0x147db0;
          secp256k1_jacobi64_maybe_var_cold_16();
          unaff_RBX = psVar8;
          unaff_R14 = psVar23;
LAB_00147db0:
          pcStack_d0 = (code *)0x147db5;
          secp256k1_jacobi64_maybe_var_cold_15();
LAB_00147db5:
          pcStack_d0 = (code *)0x147dba;
          secp256k1_jacobi64_maybe_var_cold_14();
LAB_00147dba:
          pcStack_d0 = (code *)0x147dbf;
          secp256k1_jacobi64_maybe_var_cold_13();
LAB_00147dbf:
          pcStack_d0 = (code *)0x147dc4;
          secp256k1_jacobi64_maybe_var_cold_12();
          psVar1 = (secp256k1_gej *)local_c8;
LAB_00147dc4:
          pcStack_d0 = (code *)0x147dc9;
          secp256k1_jacobi64_maybe_var_cold_11();
LAB_00147dc9:
          psVar21 = psVar1;
          pcStack_d0 = (code *)0x147dce;
          secp256k1_jacobi64_maybe_var_cold_10();
LAB_00147dce:
          pcStack_d0 = (code *)0x147dd3;
          secp256k1_jacobi64_maybe_var_cold_9();
          psVar22 = psVar21;
LAB_00147dd3:
          pcStack_d0 = (code *)0x147dd8;
          secp256k1_jacobi64_maybe_var_cold_8();
          unaff_R13 = psVar22;
          unaff_R15 = psVar25;
          goto LAB_00147dd8;
        }
        psVar25 = (secp256k1_gej *)(local_c8 + 0x30);
        iVar7 = (int)unaff_R14;
        pcStack_d0 = (code *)0x147c2e;
        psVar12 = unaff_R14;
        x = (secp256k1_modinv64_signed62 *)psVar25;
        iVar6 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar25,iVar7,
                           (secp256k1_modinv64_signed62 *)local_c8._96_8_,0);
        if (iVar6 < 1) goto LAB_00147db0;
        pcStack_d0 = (code *)0x147c49;
        psVar12 = unaff_R14;
        x = (secp256k1_modinv64_signed62 *)psVar25;
        iVar6 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar25,iVar7,
                           (secp256k1_modinv64_signed62 *)unaff_RBX,1);
        if (0 < iVar6) goto LAB_00147db5;
        pcStack_d0 = (code *)0x147c61;
        psVar12 = unaff_R14;
        x = (secp256k1_modinv64_signed62 *)local_c8;
        iVar6 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)local_c8,iVar7,
                           (secp256k1_modinv64_signed62 *)unaff_RBX,0);
        if (iVar6 < 1) goto LAB_00147dba;
        pcStack_d0 = (code *)0x147c7c;
        psVar12 = unaff_R14;
        x = (secp256k1_modinv64_signed62 *)local_c8;
        iVar6 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)local_c8,iVar7,
                           (secp256k1_modinv64_signed62 *)unaff_RBX,1);
        if (-1 < iVar6) goto LAB_00147dbf;
        pcStack_d0 = (code *)0x147c97;
        secp256k1_modinv64_update_fg_62_var
                  (iVar7,(secp256k1_modinv64_signed62 *)psVar25,
                   (secp256k1_modinv64_signed62 *)local_c8,
                   (secp256k1_modinv64_trans2x2 *)(local_c8 + 0x78));
        psVar25 = (secp256k1_gej *)local_c8._48_8_;
        if ((secp256k1_gej *)local_c8._48_8_ == (secp256k1_gej *)0x1) {
          if (iVar7 < 2) {
LAB_00147d67:
            return 1 - (uVar20 * 2 & 2);
          }
          psVar12 = (secp256k1_ge *)0x1;
          uVar13 = 0;
          do {
            uVar13 = uVar13 | *(ulong *)(local_c8 + (long)psVar12 * 8 + 0x30);
            psVar12 = (secp256k1_ge *)((long)(psVar12->x).n + 1);
          } while (unaff_R14 != psVar12);
          if (uVar13 == 0) goto LAB_00147d67;
        }
        lVar10 = (long)iVar7;
        if ((-1 < lVar10 + -2 && *(long *)(local_c8 + lVar10 * 8 + 0x28) == 0) &&
            (&pcStack_d0)[lVar10] == (code *)0x0) {
          unaff_R14 = (secp256k1_ge *)(ulong)(iVar7 - 1);
        }
        psVar1 = (secp256k1_gej *)(local_c8 + 0x30);
        pcStack_d0 = (code *)0x147cfe;
        iVar7 = (int)unaff_R14;
        psVar12 = unaff_R14;
        x = (secp256k1_modinv64_signed62 *)psVar1;
        iVar6 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar1,iVar7,
                           (secp256k1_modinv64_signed62 *)unaff_RBX,0);
        if (iVar6 < 1) goto LAB_00147dc4;
        pcStack_d0 = (code *)0x147d19;
        psVar12 = unaff_R14;
        x = (secp256k1_modinv64_signed62 *)psVar1;
        iVar6 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar1,iVar7,
                           (secp256k1_modinv64_signed62 *)unaff_RBX,1);
        if (0 < iVar6) goto LAB_00147dc9;
        pcStack_d0 = (code *)0x147d34;
        psVar12 = unaff_R14;
        x = (secp256k1_modinv64_signed62 *)local_c8;
        iVar6 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)local_c8,iVar7,
                           (secp256k1_modinv64_signed62 *)unaff_RBX,0);
        if (iVar6 < 1) goto LAB_00147dce;
        pcStack_d0 = (code *)0x147d4f;
        psVar12 = unaff_R14;
        x = (secp256k1_modinv64_signed62 *)local_c8;
        iVar6 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)local_c8,iVar7,
                           (secp256k1_modinv64_signed62 *)unaff_RBX,1);
        if (-1 < iVar6) goto LAB_00147dd3;
        uVar20 = (int)local_c8._104_8_ + 1;
        local_c8._104_8_ = ZEXT48(uVar20);
        psVar8 = unaff_R12;
        if (uVar20 == 0xc) {
          return 0;
        }
      } while( true );
    }
  }
  pcStack_d0 = secp256k1_ecmult_const;
  secp256k1_jacobi64_maybe_var_cold_17();
  psStack_f8 = unaff_RBX;
  psStack_f0 = unaff_R12;
  psStack_e8 = unaff_R13;
  psStack_e0 = unaff_R14;
  psStack_d8 = unaff_R15;
  pcStack_d0 = unaff_RBP;
  secp256k1_ge_verify(psVar12);
  if (psVar12->infinity != 0) {
    secp256k1_gej_set_infinity((secp256k1_gej *)x);
    return extraout_EAX;
  }
  secp256k1_scalar_add(&sStack_e20,a,&secp256k1_ecmult_const_K);
  secp256k1_scalar_half(&sStack_e20,&sStack_e20);
  secp256k1_scalar_split_lambda
            ((secp256k1_scalar *)auStack_f30,(secp256k1_scalar *)auStack_f10,&sStack_e20);
  secp256k1_scalar_add
            ((secp256k1_scalar *)auStack_f30,(secp256k1_scalar *)auStack_f30,
             &secp256k1_ecmult_const::S_OFFSET);
  psVar8 = (secp256k1_ge *)auStack_f10;
  secp256k1_scalar_add
            ((secp256k1_scalar *)auStack_f10,(secp256k1_scalar *)auStack_f10,
             &secp256k1_ecmult_const::S_OFFSET);
  uVar13 = 0x81;
  while( true ) {
    psVar23 = (secp256k1_ge *)auStack_f30;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_f30);
    if ((*(ulong *)(auStack_f30 + (uVar13 >> 6) * 8) >> (uVar13 & 0x3f) & 1) != 0) break;
    psVar23 = (secp256k1_ge *)auStack_f10;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_f10);
    if ((*(ulong *)(auStack_f10 + (uVar13 >> 6) * 8) & 1L << ((byte)uVar13 & 0x3f)) != 0)
    goto LAB_00148330;
    uVar20 = (int)uVar13 + 1;
    uVar13 = (ulong)uVar20;
    if (uVar20 == 0x100) {
      secp256k1_gej_set_ge((secp256k1_gej *)x,psVar12);
      secp256k1_ecmult_odd_multiples_table
                (0x10,&sStack_780,&sStack_e00.x,&sStack_e50,(secp256k1_gej *)x);
      secp256k1_ge_table_set_globalz(0x10,&sStack_780,&sStack_e00.x);
      lVar10 = 0;
      do {
        secp256k1_ge_mul_lambda
                  ((secp256k1_ge *)((long)sStack_e00.x.n + lVar10),
                   (secp256k1_ge *)((long)sStack_780.x.n + lVar10));
        lVar10 = lVar10 + 0x68;
      } while (lVar10 != 0x680);
      iVar6 = 0x19;
      psVar12 = (secp256k1_ge *)(auStack_f10 + 0x50);
      do {
        secp256k1_scalar_verify((secp256k1_scalar *)auStack_f30);
        uVar20 = iVar6 * 5 + 4U >> 6;
        uVar11 = (uint)(iVar6 * 5) >> 6;
        bVar4 = (byte)(iVar6 * 5) & 0x3f;
        if (uVar20 == uVar11) {
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_f30);
          uVar20 = uVar20 << 3;
          uVar26 = *(ulong *)(auStack_f30 + uVar20) >> bVar4;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_f10);
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_f10);
          uStack_f40 = *(ulong *)(auStack_f10 + uVar20) >> bVar4;
        }
        else {
          uVar13 = (ulong)(uVar11 << 3);
          uVar26 = *(ulong *)(auStack_f30 + uVar13) >> bVar4 |
                   *(long *)(auStack_f30 + uVar13 + 8) << 0x40 - bVar4;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_f10);
          uStack_f40 = *(ulong *)(auStack_f10 + uVar13) >> bVar4 |
                       *(long *)(auStack_f10 + uVar13 + 8) << 0x40 - bVar4;
        }
        uVar20 = (uint)((uVar26 & 0x10) == 0);
        uStack_ea0 = sStack_780.x.n[4];
        iStack_e98 = sStack_780.x.magnitude;
        iStack_e94 = sStack_780.x.normalized;
        uStack_eb0 = sStack_780.x.n[2];
        uStack_ea8 = sStack_780.x.n[3];
        auStack_f10._80_8_ = sStack_780.x.n[0];
        uStack_eb8 = sStack_780.x.n[1];
        sStack_e90.n[0] = sStack_780.y.n[0];
        sStack_e90.n[1] = sStack_780.y.n[1];
        sStack_e90.n[4] = sStack_780.y.n[4];
        sStack_e90.magnitude = sStack_780.y.magnitude;
        sStack_e90.normalized = sStack_780.y.normalized;
        sStack_e90.n[2] = sStack_780.y.n[2];
        sStack_e90.n[3] = sStack_780.y.n[3];
        uVar13 = 1;
        psVar24 = asStack_6e8;
        do {
          uVar11 = (uint)(((-uVar20 ^ (uint)uVar26) & 0xf) == uVar13);
          secp256k1_fe_cmov((secp256k1_fe *)psVar12,psVar24 + -1,uVar11);
          secp256k1_fe_cmov(&sStack_e90,psVar24,uVar11);
          uVar13 = uVar13 + 1;
          psVar24 = (secp256k1_fe *)(psVar24[2].n + 1);
        } while (uVar13 != 0x10);
        uStack_e60 = 0;
        secp256k1_fe_verify(&sStack_e90);
        secp256k1_fe_verify_magnitude(&sStack_e90,1);
        auStack_f10._32_8_ = 0x3ffffbfffff0bc - sStack_e90.n[0];
        auStack_f10._40_8_ = 0x3ffffffffffffc - sStack_e90.n[1];
        auStack_f10._48_8_ = 0x3ffffffffffffc - sStack_e90.n[2];
        auStack_f10._56_8_ = 0x3ffffffffffffc - sStack_e90.n[3];
        auStack_f10._64_8_ = 0x3fffffffffffc - sStack_e90.n[4];
        auStack_f10._72_8_ = 2;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_f10 + 0x20));
        secp256k1_fe_cmov(&sStack_e90,(secp256k1_fe *)(auStack_f10 + 0x20),uVar20);
        if (iVar6 == 0x19) {
          secp256k1_gej_set_ge((secp256k1_gej *)x,psVar12);
        }
        else {
          iVar7 = 5;
          do {
            secp256k1_gej_double((secp256k1_gej *)x,(secp256k1_gej *)x);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
          secp256k1_gej_add_ge((secp256k1_gej *)x,(secp256k1_gej *)x,psVar12);
        }
        uVar20 = (uint)((uStack_f40 & 0x10) == 0);
        uStack_ea0 = sStack_e00.x.n[4];
        iStack_e98 = sStack_e00.x.magnitude;
        iStack_e94 = sStack_e00.x.normalized;
        uStack_eb0 = sStack_e00.x.n[2];
        uStack_ea8 = sStack_e00.x.n[3];
        auStack_f10._80_8_ = sStack_e00.x.n[0];
        uStack_eb8 = sStack_e00.x.n[1];
        sStack_e90.n[0] = sStack_e00.y.n[0];
        sStack_e90.n[1] = sStack_e00.y.n[1];
        sStack_e90.n[4] = sStack_e00.y.n[4];
        sStack_e90.magnitude = sStack_e00.y.magnitude;
        sStack_e90.normalized = sStack_e00.y.normalized;
        sStack_e90.n[2] = sStack_e00.y.n[2];
        sStack_e90.n[3] = sStack_e00.y.n[3];
        uVar13 = 1;
        psVar24 = asStack_d68;
        do {
          uVar11 = (uint)(((-uVar20 ^ (uint)uStack_f40) & 0xf) == uVar13);
          secp256k1_fe_cmov((secp256k1_fe *)psVar12,psVar24 + -1,uVar11);
          secp256k1_fe_cmov(&sStack_e90,psVar24,uVar11);
          uVar13 = uVar13 + 1;
          psVar24 = (secp256k1_fe *)(psVar24[2].n + 1);
        } while (uVar13 != 0x10);
        uStack_e60 = 0;
        secp256k1_fe_verify(&sStack_e90);
        secp256k1_fe_verify_magnitude(&sStack_e90,1);
        auStack_f10._32_8_ = 0x3ffffbfffff0bc - sStack_e90.n[0];
        auStack_f10._40_8_ = 0x3ffffffffffffc - sStack_e90.n[1];
        auStack_f10._48_8_ = 0x3ffffffffffffc - sStack_e90.n[2];
        auStack_f10._56_8_ = 0x3ffffffffffffc - sStack_e90.n[3];
        auStack_f10._64_8_ = 0x3fffffffffffc - sStack_e90.n[4];
        auStack_f10._72_8_ = 2;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_f10 + 0x20));
        secp256k1_fe_cmov(&sStack_e90,(secp256k1_fe *)(auStack_f10 + 0x20),uVar20);
        secp256k1_gej_add_ge((secp256k1_gej *)x,(secp256k1_gej *)x,psVar12);
        bVar27 = iVar6 != 0;
        iVar6 = iVar6 + -1;
      } while (bVar27);
      secp256k1_fe_mul(&((secp256k1_gej *)x)->z,&((secp256k1_gej *)x)->z,&sStack_e50);
      return extraout_EAX_00;
    }
  }
  secp256k1_ecmult_const_cold_1();
LAB_00148330:
  secp256k1_ecmult_const_cold_2();
  secp256k1_ge_verify(psVar8);
  psVar12 = psVar23;
  for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
    (psVar12->x).n[0] = (psVar8->x).n[0];
    psVar8 = (secp256k1_ge *)((long)psVar8 + (ulong)bVar4 * -0x10 + 8);
    psVar12 = (secp256k1_ge *)((long)psVar12 + (ulong)bVar4 * -0x10 + 8);
  }
  secp256k1_fe_mul(&psVar23->x,&psVar23->x,&secp256k1_const_beta);
  secp256k1_ge_verify(psVar23);
  return extraout_EAX_01;
}

Assistant:

static int secp256k1_jacobi64_maybe_var(const secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4]) != 0);

    for (count = 0; count < JACOBI64_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 62 posdivsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_posdivsteps_62_var(eta, f.v[0] | ((uint64_t)f.v[1] << 62), g.v[0] | ((uint64_t)g.v[1] << 62), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. When f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1550 iterations. Return 0, indicating unknown result. */
    return 0;
}